

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

DThinker * __thiscall
FDecalColorerAnim::CreateThinker(FDecalColorerAnim *this,DBaseDecal *actor,side_t *wall)

{
  DDecalColorer *this_00;
  DDecalColorer *Colorer;
  side_t *wall_local;
  DBaseDecal *actor_local;
  FDecalColorerAnim *this_local;
  
  this_00 = (DDecalColorer *)DObject::operator_new((DObject *)0x50,(size_t)actor);
  DDecalColorer::DDecalColorer(this_00,actor);
  this_00->TimeToStartDecay = ::level.maptime + *(int *)&(this->super_FDecalAnimator).field_0xc;
  this_00->TimeToEndDecay = this_00->TimeToStartDecay + this->DecayTime;
  PalEntry::operator=(&this_00->StartColor,0xff000000);
  (this_00->GoalColor).field_0 = (this->GoalColor).field_0;
  return (DThinker *)this_00;
}

Assistant:

DThinker *FDecalColorerAnim::CreateThinker (DBaseDecal *actor, side_t *wall) const
{
	DDecalColorer *Colorer = new DDecalColorer (actor);

	Colorer->TimeToStartDecay = level.maptime + DecayStart;
	Colorer->TimeToEndDecay = Colorer->TimeToStartDecay + DecayTime;
	Colorer->StartColor = 0xff000000;
	Colorer->GoalColor = GoalColor;
	return Colorer;
}